

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O1

void __thiscall
Diligent::VariableSizeAllocationsManager::Free
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  TFreeBlocksBySizeMap *this_00;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  OffsetType OVar3;
  VariableSizeAllocationsManager *this_01;
  const_iterator __position;
  const_iterator cVar4;
  char (*in_RCX) [66];
  _Base_ptr Args_1;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  OffsetType Size_00;
  OffsetType OVar7;
  string msg;
  string local_60;
  VariableSizeAllocationsManager *local_40;
  OffsetType local_38;
  
  if ((Offset == 0xffffffffffffffff) || (this->m_MaxSize < Offset + Size)) {
    FormatString<char[26],char[66]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize",
               in_RCX);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var6 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = p_Var1;
  cVar4._M_node = &p_Var6->_M_header;
  for (; Args_1 = &p_Var6->_M_header, p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) <= Offset]) {
    if (Offset < *(ulong *)(p_Var2 + 1)) {
      cVar4._M_node = p_Var2;
    }
  }
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < Offset]) {
    if (*(ulong *)(p_Var1 + 1) >= Offset) {
      Args_1 = p_Var1;
    }
  }
  local_40 = this;
  if (Args_1 != cVar4._M_node) {
    FormatString<char[26],char[22]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LowBnd == NextBlockIt",(char (*) [22])Args_1);
    Args_1 = (_Base_ptr)0x122;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x122);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (((_Rb_tree_header *)cVar4._M_node != p_Var6) &&
     (*(ulong *)(cVar4._M_node + 1) < Offset + Size)) {
    FormatString<char[26],char[81]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first",
               (char (*) [81])Args_1);
    Args_1 = (_Base_ptr)0x126;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x126);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  __position._M_node = &p_Var6->_M_header;
  local_38 = Size;
  if ((cVar4._M_node !=
       (local_40->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) &&
     (__position._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar4._M_node),
     Offset < (ulong)((long)&(__position._M_node[1]._M_parent)->_M_color +
                     *(long *)(__position._M_node + 1)))) {
    FormatString<char[26],char[56]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset >= PrevBlockIt->first + PrevBlockIt->second.Size",
               (char (*) [56])Args_1);
    Args_1 = (_Base_ptr)0x12c;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  OVar7 = local_38;
  this_01 = local_40;
  if ((_Rb_tree_header *)__position._M_node != p_Var6) {
    OVar3 = *(OffsetType *)(__position._M_node + 1);
    if ((long)&(__position._M_node[1]._M_parent)->_M_color + OVar3 == Offset) {
      Size_00 = (long)&(__position._M_node[1]._M_parent)->_M_color + local_38;
      if (((_Rb_tree_header *)cVar4._M_node == p_Var6) ||
         (Offset + local_38 != *(long *)(cVar4._M_node + 1))) {
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
        ::_M_erase_aux(&(local_40->m_FreeBlocksBySize)._M_t,__position._M_node[1]._M_left);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
        ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                        *)this_01,__position);
        Offset = OVar3;
      }
      else {
        p_Var2 = cVar4._M_node[1]._M_parent;
        this_00 = &local_40->m_FreeBlocksBySize;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
        ::_M_erase_aux(&this_00->_M_t,__position._M_node[1]._M_left);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
        ::_M_erase_aux(&this_00->_M_t,cVar4._M_node[1]._M_left);
        cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
        ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                        *)this_01,__position,cVar4);
        Size_00 = (long)&p_Var2->_M_color + Size_00;
        OVar7 = local_38;
        Offset = OVar3;
      }
      goto LAB_00254be2;
    }
  }
  Size_00 = local_38;
  if (((_Rb_tree_header *)cVar4._M_node != p_Var6) &&
     (Offset + local_38 == *(long *)(cVar4._M_node + 1))) {
    Size_00 = (long)&(cVar4._M_node[1]._M_parent)->_M_color + local_38;
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
    ::_M_erase_aux(&(local_40->m_FreeBlocksBySize)._M_t,cVar4._M_node[1]._M_left);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                    *)this_01,cVar4);
  }
LAB_00254be2:
  AddNewBlock(this_01,Offset,Size_00);
  OVar7 = OVar7 + this_01->m_FreeSize;
  this_01->m_FreeSize = OVar7;
  if (OVar7 == this_01->m_MaxSize) {
    if ((this_01->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
      FormatString<char[26],char[24]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetNumFreeBlocks() == 1",(char (*) [24])Args_1);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x16d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    Args_1 = (_Base_ptr)0x1;
    do {
      p_Var5 = Args_1;
      Args_1 = (_Base_ptr)((long)p_Var5 * 2);
    } while (Args_1 <= (_Base_ptr)this_01->m_MaxSize);
    this_01->m_CurrAlignment = (OffsetType)p_Var5;
  }
  if ((this_01->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this_01->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[26],char[57]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
               (char (*) [57])Args_1);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x172);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (this_01->m_DbgDisableDebugValidation == false) {
    DbgVerifyList(this_01);
  }
  return;
}

Assistant:

void Free(OffsetType Offset, OffsetType Size)
    {
        VERIFY_EXPR(Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize);

        // Find the first element whose offset is greater than the specified offset.
        // upper_bound() returns an iterator pointing to the first element in the
        // container whose key is considered to go after k.
        auto NextBlockIt = m_FreeBlocksByOffset.upper_bound(Offset);
#ifdef DILIGENT_DEBUG
        {
            auto LowBnd = m_FreeBlocksByOffset.lower_bound(Offset); // First element whose offset is  >=
            // Since zero-size allocations are not allowed, lower bound must always be equal to the upper bound
            VERIFY_EXPR(LowBnd == NextBlockIt);
        }
#endif
        // Block being deallocated must not overlap with the next block
        VERIFY_EXPR(NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first);
        auto PrevBlockIt = NextBlockIt;
        if (PrevBlockIt != m_FreeBlocksByOffset.begin())
        {
            --PrevBlockIt;
            // Block being deallocated must not overlap with the previous block
            VERIFY_EXPR(Offset >= PrevBlockIt->first + PrevBlockIt->second.Size);
        }
        else
            PrevBlockIt = m_FreeBlocksByOffset.end();

        OffsetType NewSize, NewOffset;
        if (PrevBlockIt != m_FreeBlocksByOffset.end() && Offset == PrevBlockIt->first + PrevBlockIt->second.Size)
        {
            //  PrevBlock.Offset             Offset
            //       |                          |
            //       |<-----PrevBlock.Size----->|<------Size-------->|
            //
            NewSize   = PrevBlockIt->second.Size + Size;
            NewOffset = PrevBlockIt->first;

            if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
            {
                //   PrevBlock.Offset           Offset            NextBlock.Offset
                //     |                          |                    |
                //     |<-----PrevBlock.Size----->|<------Size-------->|<-----NextBlock.Size----->|
                //
                NewSize += NextBlockIt->second.Size;
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
                // Delete the range of two blocks
                ++NextBlockIt;
                m_FreeBlocksByOffset.erase(PrevBlockIt, NextBlockIt);
            }
            else
            {
                //   PrevBlock.Offset           Offset                     NextBlock.Offset
                //     |                          |                             |
                //     |<-----PrevBlock.Size----->|<------Size-------->| ~ ~ ~  |<-----NextBlock.Size----->|
                //
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksByOffset.erase(PrevBlockIt);
            }
        }
        else if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
        {
            //   PrevBlock.Offset                   Offset            NextBlock.Offset
            //     |                                  |                    |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->|<-----NextBlock.Size----->|
            //
            NewSize   = Size + NextBlockIt->second.Size;
            NewOffset = Offset;
            m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
            m_FreeBlocksByOffset.erase(NextBlockIt);
        }
        else
        {
            //   PrevBlock.Offset                   Offset                     NextBlock.Offset
            //     |                                  |                            |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~ |<-----NextBlock.Size----->|
            //
            NewSize   = Size;
            NewOffset = Offset;
        }

        AddNewBlock(NewOffset, NewSize);

        m_FreeSize += Size;
        if (IsEmpty())
        {
            // Reset current alignment
            VERIFY_EXPR(GetNumFreeBlocks() == 1);
            ResetCurrAlignment();
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
    }